

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarySearch.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  size_type sVar4;
  ostream *poVar5;
  clock_t cVar6;
  clock_t cVar7;
  int position;
  clock_t t;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *searchInts;
  allocator local_31;
  string local_30 [8];
  string inFileName;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  while( true ) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"");
    if (!bVar1) break;
    std::operator<<((ostream *)&std::cout,
                    "Please type the filename that you would like to search for 0 in: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  }
  pvVar3 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  std::vector<int,_std::allocator<int>_>::vector(pvVar3);
  local_50 = pvVar3;
  std::__cxx11::string::string((string *)&t,local_30);
  ReadFile((string *)&t,local_50);
  std::__cxx11::string::~string((string *)&t);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_50);
  if (sVar4 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"File does not exist!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  cVar6 = clock();
  pvVar3 = local_50;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_50);
  iVar2 = binarySearch(pvVar3,0,(int)sVar4,0);
  cVar7 = clock();
  poVar5 = std::operator<<((ostream *)&std::cout,"Total time was ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,cVar7 - cVar6);
  poVar5 = std::operator<<(poVar5," processor cycles.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (iVar2 == -1) {
    poVar5 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"No 0 found!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Found 0 at position: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," (0-indexed)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
    std::string inFileName = "";

    while(inFileName == "")
    {
        std::cout << "Please type the filename that you would like to search for 0 in: ";
        getline(std::cin, inFileName);
    }

    std::vector<int> *searchInts = new std::vector<int>;
    ReadFile(inFileName, searchInts);
    if(searchInts->size() == 0)
    {
        std::cout << "File does not exist!" << std::endl;
        exit(1);
    }
    std::clock_t t;
    t = clock();
    int position = binarySearch(searchInts, 0, searchInts->size(), 0);
    t = clock() - t;
    std::cout << "Total time was " << t << " processor cycles." << std::endl;

    if(position == -1)
    {
        std::cout << std::endl << "No 0 found!" << std::endl;
    }
    else
    {
        std::cout << std::endl << "Found 0 at position: " << position << " (0-indexed)" << std::endl;
    }

    return 0;
}